

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_4::renderReference
               (PixelBufferAccess *dst,
               vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *drawOps,PixelFormat *colorBits,int depthBits,int stencilBits,int numSamples)

{
  Winding height;
  HorizontalFill depth;
  BlendMode BVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  pointer pDVar5;
  Renderer referenceRenderer;
  DrawCommand local_420;
  TextureLevel colorBuffer;
  TextureLevel stencilBuffer;
  TextureLevel depthBuffer;
  MultisamplePixelBufferAccess local_378;
  undefined1 local_350 [16];
  GeometryShader *local_340;
  ReferenceShader shader;
  VertexAttrib local_2b8;
  undefined8 uStack_290;
  undefined8 local_288;
  pointer pVStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  MultisamplePixelBufferAccess local_260;
  RenderState renderState;
  PixelBufferAccess local_150;
  RenderTarget renderTarget;
  
  height = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  depth = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  tcu::TextureLevel::TextureLevel(&colorBuffer);
  tcu::TextureLevel::TextureLevel(&depthBuffer);
  tcu::TextureLevel::TextureLevel(&stencilBuffer);
  rr::Renderer::Renderer(&referenceRenderer);
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  pVStack_280 = (pointer)0x0;
  local_2b8.generic.v._8_8_ = 0;
  uStack_290 = 0;
  local_2b8.pointer = (pointer)0x0;
  local_2b8.generic.v._0_8_ = 0;
  rr::VertexShader::VertexShader(&shader.super_VertexShader,2,1);
  rr::FragmentShader::FragmentShader(&shader.super_FragmentShader,1,1);
  shader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_01e08020;
  shader.super_FragmentShader._vptr_FragmentShader = (_func_int **)&DAT_01e08040;
  *(undefined8 *)
   shader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  (shader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (shader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (shader.super_FragmentShader.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (shader.super_FragmentShader.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (shader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_2b8.type = VERTEXATTRIBTYPE_FLOAT;
  local_2b8.size = 4;
  local_2b8.stride = 0;
  local_2b8.instanceDivisor = 0;
  uStack_290 = 0x400000000;
  local_288 = 0;
  uVar4 = colorBits->blueBits << 8 | colorBits->greenBits << 0x10 | colorBits->redBits << 0x18 |
          colorBits->alphaBits;
  if (uVar4 == 0x4040404) {
    uVar2 = 0xa00000000;
  }
  else if (uVar4 == 0x5050501) {
    uVar2 = 0xb00000000;
  }
  else {
    uVar3 = 7;
    if (uVar4 == 0x5060500) {
      uVar2 = 0x800000000;
      goto LAB_00e08f36;
    }
    uVar2 = 0x300000000;
    if (uVar4 == 0x8080800) goto LAB_00e08f36;
  }
  uVar3 = 8;
LAB_00e08f36:
  renderTarget._0_8_ = uVar2 | uVar3;
  tcu::TextureLevel::setStorage(&colorBuffer,(TextureFormat *)&renderTarget,1,height,depth);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderTarget,&colorBuffer);
  renderState.cullMode = CULLMODE_NONE;
  renderState.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
  renderState.rasterization.winding = height;
  renderState.rasterization.horizontalFill = depth;
  rr::clearMultisampleColorBuffer
            ((PixelBufferAccess *)&renderTarget,(Vec4 *)CLEAR_COLOR,(WindowRectangle *)&renderState)
  ;
  if (0 < depthBits) {
    uVar4 = depthBits << 0x1d | (uint)depthBits >> 3;
    if (uVar4 < 4) {
      renderTarget._0_8_ =
           *(ulong *)(&DAT_017f5890 + (ulong)uVar4 * 8) |
           *(ulong *)(&DAT_017f5870 + (ulong)uVar4 * 8);
    }
    else {
      renderTarget._0_8_ = 0x2300000012;
    }
    tcu::TextureLevel::setStorage(&depthBuffer,(TextureFormat *)&renderTarget,1,height,depth);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderTarget,&depthBuffer);
    renderState.cullMode = CULLMODE_NONE;
    renderState.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    renderState.rasterization.winding = height;
    renderState.rasterization.horizontalFill = depth;
    rr::clearMultisampleDepthBuffer
              ((PixelBufferAccess *)&renderTarget,1.0,(WindowRectangle *)&renderState);
  }
  if (0 < stencilBits) {
    renderTarget._0_8_ = 0x1e00000013;
    tcu::TextureLevel::setStorage(&stencilBuffer,(TextureFormat *)&renderTarget,1,height,depth);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderTarget,&stencilBuffer);
    renderState.cullMode = CULLMODE_NONE;
    renderState.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    renderState.rasterization.winding = height;
    renderState.rasterization.horizontalFill = depth;
    rr::clearMultisampleStencilBuffer
              ((PixelBufferAccess *)&renderTarget,0,(WindowRectangle *)&renderState);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_420,&colorBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess
            ((MultisamplePixelBufferAccess *)&renderState,(PixelBufferAccess *)&local_420);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_350,&depthBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_260,(PixelBufferAccess *)local_350)
  ;
  tcu::TextureLevel::getAccess(&local_150,&stencilBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_378,&local_150);
  rr::RenderTarget::RenderTarget
            (&renderTarget,(MultisamplePixelBufferAccess *)&renderState,&local_260,&local_378);
  pDVar5 = (drawOps->
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pDVar5 == (drawOps->
                  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TextureLevel::getAccess(&local_260.m_access,&colorBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess
                ((MultisamplePixelBufferAccess *)&local_420,&local_260.m_access);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&renderState,
                 (MultisamplePixelBufferAccess *)&local_420);
      rr::resolveMultisampleColorBuffer(dst,(MultisampleConstPixelBufferAccess *)&renderState);
      ReferenceShader::~ReferenceShader(&shader);
      rr::Renderer::~Renderer(&referenceRenderer);
      tcu::TextureLevel::~TextureLevel(&stencilBuffer);
      tcu::TextureLevel::~TextureLevel(&depthBuffer);
      tcu::TextureLevel::~TextureLevel(&colorBuffer);
      return;
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_350,&colorBuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess
              (&local_260,(PixelBufferAccess *)local_350);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&local_420,&local_260);
    local_378.m_access.super_ConstPixelBufferAccess.m_format.order = R;
    local_378.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    local_378.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = local_420.renderTarget._4_4_;
    local_378.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)local_420.program;
    local_378.m_access.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    local_378.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f800000;
    rr::RenderState::RenderState
              (&renderState,(ViewportState *)&local_378,VIEWPORTORIENTATION_LOWER_LEFT);
    renderState._0_8_ = renderState._0_8_ & 0xffffffff00000000;
    BVar1 = pDVar5->blend;
    if (BVar1 != BLENDMODE_NONE) {
      renderState.fragOps.blendMode = BLENDMODE_STANDARD;
      if (BVar1 == BLENDMODE_ADDITIVE) {
        renderState.fragOps.blendRGBState.srcFunc = BLENDFUNC_ONE;
        renderState.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE;
      }
      else {
        if (BVar1 != BLENDMODE_SRC_OVER) goto LAB_00e091f0;
        renderState.fragOps.blendRGBState.srcFunc = BLENDFUNC_SRC_ALPHA;
        renderState.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
      }
      renderState.fragOps.blendRGBState.equation = BLENDEQUATION_ADD;
      renderState.fragOps.blendAState._0_8_ =
           (ulong)renderState.fragOps.blendRGBState.srcFunc << 0x20;
      renderState.fragOps.blendAState.dstFunc = renderState.fragOps.blendRGBState.dstFunc;
    }
LAB_00e091f0:
    if (pDVar5->depth != DEPTHMODE_NONE) {
      renderState.fragOps.depthTestEnabled = true;
      renderState.fragOps.depthFunc = TESTFUNC_LESS;
    }
    if (pDVar5->stencil != STENCILMODE_NONE) {
      renderState.fragOps.stencilTestEnabled = true;
      renderState.fragOps.stencilStates[0].func = STENCILOP_INCR;
      renderState.fragOps.stencilStates[0].sFail = STENCILOP_KEEP;
      renderState.fragOps.stencilStates[0].dpFail = STENCILOP_INCR;
      renderState.fragOps.stencilStates[0].ref = pDVar5->stencilRef;
      renderState.fragOps.stencilStates[1].ref = renderState.fragOps.stencilStates[0].ref;
      renderState.fragOps.stencilStates[1].func = TESTFUNC_LEQUAL;
      renderState.fragOps.stencilStates[1].writeMask =
           renderState.fragOps.stencilStates[0].writeMask;
      renderState.fragOps.stencilStates[1].dpPass = STENCILOP_INCR;
      renderState.fragOps.stencilStates[1].dpFail = STENCILOP_INCR;
      renderState.fragOps.stencilStates[1].sFail = STENCILOP_KEEP;
      renderState.fragOps.stencilStates[0].dpPass = renderState.fragOps.stencilStates[0].func;
    }
    local_2b8.pointer =
         (pDVar5->positions).
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    pVStack_280 = (pDVar5->colors).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_350._0_8_ = &shader;
    local_350._8_8_ = &shader.super_FragmentShader;
    local_340 = (GeometryShader *)0x0;
    rr::PrimitiveList::PrimitiveList
              ((PrimitiveList *)&local_260,PRIMITIVETYPE_TRIANGLES,pDVar5->count * 3,0);
    local_420.renderTarget = &renderTarget;
    local_420.numVertexAttribs = 2;
    local_420.vertexAttribs = &local_2b8;
    local_420.state = &renderState;
    local_420.program = (Program *)local_350;
    local_420.primitives = (PrimitiveList *)&local_260;
    rr::Renderer::draw(&referenceRenderer,&local_420);
    pDVar5 = pDVar5 + 1;
  } while( true );
}

Assistant:

void renderReference (const tcu::PixelBufferAccess& dst, const vector<DrawPrimitiveOp>& drawOps, const tcu::PixelFormat& colorBits, const int depthBits, const int stencilBits, const int numSamples)
{
	const int						width			= dst.getWidth();
	const int						height			= dst.getHeight();

	tcu::TextureLevel				colorBuffer;
	tcu::TextureLevel				depthBuffer;
	tcu::TextureLevel				stencilBuffer;

	rr::Renderer					referenceRenderer;
	rr::VertexAttrib				attributes[2];
	const ReferenceShader			shader;

	attributes[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[0].size				= 4;
	attributes[0].stride			= 0;
	attributes[0].instanceDivisor	= 0;

	attributes[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[1].size				= 4;
	attributes[1].stride			= 0;
	attributes[1].instanceDivisor	= 0;

	// Initialize buffers.
	colorBuffer.setStorage(getColorFormat(colorBits), numSamples, width, height);
	rr::clearMultisampleColorBuffer(colorBuffer, CLEAR_COLOR, rr::WindowRectangle(0, 0, width, height));

	if (depthBits > 0)
	{
		depthBuffer.setStorage(getDepthFormat(depthBits), numSamples, width, height);
		rr::clearMultisampleDepthBuffer(depthBuffer, CLEAR_DEPTH, rr::WindowRectangle(0, 0, width, height));
	}

	if (stencilBits > 0)
	{
		stencilBuffer.setStorage(getStencilFormat(stencilBits), numSamples, width, height);
		rr::clearMultisampleStencilBuffer(stencilBuffer, CLEAR_STENCIL, rr::WindowRectangle(0, 0, width, height));
	}

	const rr::RenderTarget renderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer.getAccess()));

	for (vector<DrawPrimitiveOp>::const_iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); drawOp++)
	{
		// Translate state
		rr::RenderState renderState((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess())));
		toReferenceRenderState(renderState, *drawOp);

		DE_ASSERT(drawOp->type == PRIMITIVETYPE_TRIANGLE);

		attributes[0].pointer = &drawOp->positions[0];
		attributes[1].pointer = &drawOp->colors[0];

		referenceRenderer.draw(
			rr::DrawCommand(
				renderState,
				renderTarget,
				rr::Program(static_cast<const rr::VertexShader*>(&shader), static_cast<const rr::FragmentShader*>(&shader)),
				2,
				attributes,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, drawOp->count * 3, 0)));
	}

	rr::resolveMultisampleColorBuffer(dst, rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()));
}